

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_properties.h
# Opt level: O1

bool __thiscall BamTools::PropertyFilterValue::check<float>(PropertyFilterValue *this,float *query)

{
  float fVar1;
  bool bVar2;
  Impl<float> *pIVar3;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  
  bVar2 = Variant::is_type<float>(&this->Value);
  if (!bVar2) {
    pcVar5 = "Cannot compare different types!";
    lVar4 = 0x1f;
LAB_00163e7f:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
switchD_00163ed1_default:
    return false;
  }
  bVar2 = Variant::is_type<std::__cxx11::string>(&this->Value);
  if (bVar2) {
    pcVar5 = "Cannot compare different types - query is a string!";
    lVar4 = 0x33;
    goto LAB_00163e7f;
  }
  switch(this->Type) {
  case EXACT:
    fVar1 = *query;
    pIVar3 = Variant::CastFromBase<float>((this->Value).data);
    bVar2 = fVar1 == pIVar3->data;
    break;
  case GREATER_THAN:
    fVar1 = *query;
    pIVar3 = Variant::CastFromBase<float>((this->Value).data);
    bVar2 = fVar1 == pIVar3->data;
    bVar6 = fVar1 < pIVar3->data;
    goto LAB_00163f77;
  case GREATER_THAN_EQUAL:
    fVar1 = *query;
    pIVar3 = Variant::CastFromBase<float>((this->Value).data);
    bVar2 = fVar1 < pIVar3->data;
    goto LAB_00163f33;
  case LESS_THAN:
    fVar1 = *query;
    pIVar3 = Variant::CastFromBase<float>((this->Value).data);
    bVar2 = pIVar3->data == fVar1;
    bVar6 = pIVar3->data < fVar1;
LAB_00163f77:
    return !bVar6 && !bVar2;
  case LESS_THAN_EQUAL:
    fVar1 = *query;
    pIVar3 = Variant::CastFromBase<float>((this->Value).data);
    bVar2 = pIVar3->data < fVar1;
LAB_00163f33:
    return !bVar2;
  case NOT:
    fVar1 = *query;
    pIVar3 = Variant::CastFromBase<float>((this->Value).data);
    bVar2 = fVar1 != pIVar3->data;
    break;
  default:
    goto switchD_00163ed1_default;
  }
  return (bool)(-bVar2 & 1);
}

Assistant:

bool PropertyFilterValue::check(const T& query) const
{

    // ensure filter value & query are same type
    if (!Value.is_type<T>()) {
        std::cerr << "Cannot compare different types!" << std::endl;
        return false;
    }

    // string matching
    if (Value.is_type<std::string>()) {
        std::cerr << "Cannot compare different types - query is a string!" << std::endl;
        return false;
    }

    // numeric matching based on our filter type
    switch (Type) {
        case (PropertyFilterValue::EXACT):
            return (query == Value.get<T>());
        case (PropertyFilterValue::GREATER_THAN):
            return (query > Value.get<T>());
        case (PropertyFilterValue::GREATER_THAN_EQUAL):
            return (query >= Value.get<T>());
        case (PropertyFilterValue::LESS_THAN):
            return (query < Value.get<T>());
        case (PropertyFilterValue::LESS_THAN_EQUAL):
            return (query <= Value.get<T>());
        case (PropertyFilterValue::NOT):
            return (query != Value.get<T>());
        default:
            BAMTOOLS_ASSERT_UNREACHABLE;
    }
    return false;
}